

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cpp
# Opt level: O3

int ncnn::rnn_int8(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc_int8,
                  float *weight_xc_int8_scales,Mat *bias_c,Mat *weight_hc_int8,
                  float *weight_hc_int8_scales,Mat *hidden_state,Option *opt)

{
  undefined4 uVar1;
  uint _w;
  uint _h;
  uint _w_00;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  size_t sVar5;
  void *pvVar6;
  undefined4 uVar7;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined4 uVar15;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined1 uVar20;
  undefined1 uVar22;
  undefined4 uVar23;
  undefined1 uVar24;
  undefined1 uVar26;
  undefined1 uVar28;
  undefined1 uVar30;
  undefined8 uVar31;
  int *piVar38;
  long lVar39;
  void *pvVar40;
  void *pvVar41;
  int iVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  long lVar47;
  int iVar48;
  uint uVar49;
  void *pvVar50;
  uint uVar51;
  void *pvVar52;
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  Option opt_quant;
  Option opt_quant_1;
  Mat local_218;
  Mat local_1c8;
  Mat local_178;
  Mat local_128;
  Mat local_d8;
  undefined8 local_88;
  undefined8 uStack_80;
  Option local_78;
  undefined4 uVar9;
  undefined3 uVar11;
  undefined2 uVar13;
  undefined4 uVar17;
  undefined3 uVar19;
  undefined2 uVar21;
  undefined4 uVar25;
  undefined3 uVar27;
  undefined2 uVar29;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined3 uVar34;
  undefined1 uVar35;
  undefined2 uVar36;
  undefined1 uVar37;
  
  _w = bottom_blob->w;
  _h = bottom_blob->h;
  _w_00 = top_blob->w;
  uVar44 = (ulong)_w_00;
  local_128.cstep = 0;
  local_128.data = (void *)0x0;
  local_128.refcount._0_4_ = 0;
  local_128.refcount._4_4_ = 0;
  local_128.elemsize._0_4_ = 0;
  local_128._20_8_ = 0;
  local_128.allocator = (Allocator *)0x0;
  local_128.dims = 0;
  local_128.w = 0;
  local_128.h = 0;
  local_128.d = 0;
  local_128.c = 0;
  Mat::create(&local_128,_w_00,4,opt->workspace_allocator);
  iVar48 = -100;
  if ((local_128.data != (void *)0x0) && ((long)local_128.c * local_128.cstep != 0)) {
    local_178.cstep = 0;
    local_178.data = (void *)0x0;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.elemsize._0_4_ = 0;
    local_178.elemsize._4_4_ = 0;
    local_178.elempack = 0;
    local_178.allocator = (Allocator *)0x0;
    local_178.dims = 0;
    local_178.w = 0;
    local_178.h = 0;
    local_178.d = 0;
    local_178.c = 0;
    Mat::create(&local_178,_w,_h,1,1,opt->workspace_allocator);
    local_d8.cstep = 0;
    local_d8.data = (void *)0x0;
    local_d8.refcount._0_4_ = 0;
    local_d8.refcount._4_4_ = 0;
    local_d8.elemsize._0_4_ = 0;
    local_d8._20_8_ = 0;
    local_d8.allocator = (Allocator *)0x0;
    local_d8.dims = 0;
    local_d8.w = 0;
    local_d8.h = 0;
    local_d8.d = 0;
    local_d8.c = 0;
    Mat::create(&local_d8,_h,4,1,opt->workspace_allocator);
    if (0 < (int)_h) {
      pvVar41 = bottom_blob->data;
      iVar48 = bottom_blob->w;
      sVar3 = bottom_blob->elemsize;
      uVar45 = 0;
      do {
        fVar53 = 0.0;
        if (0 < (int)_w) {
          uVar46 = 0;
          do {
            fVar56 = ABS(*(float *)((long)pvVar41 + uVar46 * 4));
            if (fVar53 <= fVar56) {
              fVar53 = fVar56;
            }
            uVar46 = uVar46 + 1;
          } while (_w != uVar46);
        }
        *(float *)((long)local_d8.data + uVar45 * 4) = 127.0 / fVar53;
        uVar45 = uVar45 + 1;
        pvVar41 = (void *)((long)pvVar41 + (long)iVar48 * sVar3);
      } while (uVar45 != _h);
    }
    local_218.data = *(void **)opt;
    uVar7 = opt->openmp_blocktime;
    uVar8 = opt->use_winograd_convolution;
    uVar10 = opt->use_sgemm_convolution;
    uVar12 = opt->use_int8_inference;
    uVar14 = opt->use_vulkan_compute;
    uVar13 = CONCAT11(uVar14,uVar12);
    uVar11 = CONCAT21(uVar13,uVar10);
    uVar9 = CONCAT31(uVar11,uVar8);
    uVar45._0_1_ = opt->use_bf16_storage;
    uVar45._1_1_ = opt->use_fp16_packed;
    uVar45._2_1_ = opt->use_fp16_storage;
    uVar45._3_1_ = opt->use_fp16_arithmetic;
    uVar45._4_1_ = opt->use_int8_packed;
    uVar45._5_1_ = opt->use_int8_storage;
    uVar45._6_1_ = opt->use_int8_arithmetic;
    uVar45._7_1_ = opt->use_packing_layout;
    uVar15 = opt->vulkan_device_index;
    uVar16 = opt->use_reserved_1;
    uVar18 = opt->use_image_storage;
    uVar20 = opt->use_tensor_storage;
    uVar22 = opt->use_reserved_2;
    uVar21 = CONCAT11(uVar22,uVar20);
    uVar19 = CONCAT21(uVar21,uVar18);
    uVar17 = CONCAT31(uVar19,uVar16);
    uVar23 = opt->flush_denormals;
    uVar24 = opt->use_local_pool_allocator;
    uVar26 = opt->use_shader_local_memory;
    uVar28 = opt->use_cooperative_matrix;
    uVar30 = opt->use_winograd23_convolution;
    uVar29 = CONCAT11(uVar30,uVar28);
    uVar27 = CONCAT21(uVar29,uVar26);
    uVar25 = CONCAT31(uVar27,uVar24);
    uVar31._0_1_ = opt->use_winograd43_convolution;
    uVar31._1_1_ = opt->use_winograd63_convolution;
    uVar31._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar31._3_1_ = opt->use_fp16_uniform;
    uVar32 = opt->use_int8_uniform;
    uVar33 = opt->use_reserved_9;
    uVar35 = opt->use_reserved_10;
    uVar37 = opt->use_reserved_11;
    uVar36 = CONCAT11(uVar37,uVar35);
    uVar34 = CONCAT21(uVar36,uVar33);
    uVar31._4_4_ = CONCAT31(uVar34,uVar32);
    local_218.c = (int)uVar31;
    local_218.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    local_218.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_218.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    local_218.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_218.allocator = (Allocator *)(uVar45 & 0xffffffffffffff);
    local_218.elempack = uVar7;
    local_218._28_4_ = uVar9;
    local_218.dims = uVar15;
    local_218.w = uVar17;
    local_218.h = uVar23;
    local_218.d = uVar25;
    local_218._60_4_ = uVar31._4_4_;
    quantize_to_int8(bottom_blob,&local_178,&local_d8,(Option *)&local_218);
    local_218.cstep = 0;
    local_218.data = (void *)0x0;
    local_218.refcount._0_4_ = 0;
    local_218.refcount._4_4_ = 0;
    local_218.elemsize._0_4_ = 0;
    local_218.elemsize._4_4_ = 0;
    local_218.elempack = 0;
    local_218.allocator = (Allocator *)0x0;
    local_218.dims = 0;
    local_218.w = 0;
    local_218.h = 0;
    local_218.d = 0;
    local_218.c = 0;
    Mat::create(&local_218,_w_00,1,1,opt->workspace_allocator);
    local_1c8.cstep = 0;
    local_1c8.data = (float *)0x0;
    local_1c8.refcount._0_4_ = 0;
    local_1c8.refcount._4_4_ = 0;
    local_1c8.elemsize._0_4_ = 0;
    local_1c8._20_8_ = 0;
    local_1c8.allocator = (Allocator *)0x0;
    local_1c8.dims = 0;
    local_1c8.w = 0;
    local_1c8.h = 0;
    local_1c8.d = 0;
    local_1c8.c = 0;
    Mat::create(&local_1c8,1,4,1,opt->workspace_allocator);
    if (0 < (int)_h) {
      uVar51 = 0;
      do {
        uVar49 = ~uVar51 + _h;
        if (reverse == 0) {
          uVar49 = uVar51;
        }
        if ((int)_w_00 < 1) {
LAB_0035295e:
          *(float *)local_1c8.data = 1.0;
          if (0 < local_218.c * (int)local_218.cstep) {
            memset(local_218.data,0,(ulong)(uint)(local_218.c * (int)local_218.cstep));
          }
        }
        else {
          fVar53 = 0.0;
          uVar45 = 0;
          do {
            fVar56 = ABS(*(float *)((long)hidden_state->data + uVar45 * 4));
            if (fVar53 <= fVar56) {
              fVar53 = fVar56;
            }
            uVar45 = uVar45 + 1;
          } while (uVar44 != uVar45);
          if (fVar53 == 0.0) goto LAB_0035295e;
          *(float *)local_1c8.data = 127.0 / fVar53;
          local_78.lightmode = opt->lightmode;
          local_78.use_shader_pack8 = opt->use_shader_pack8;
          local_78.use_subgroup_ops = opt->use_subgroup_ops;
          local_78.use_reserved_0 = opt->use_reserved_0;
          local_78.num_threads = opt->num_threads;
          local_78.workspace_allocator = opt->workspace_allocator;
          local_78.openmp_blocktime = opt->openmp_blocktime;
          local_78.use_winograd_convolution = opt->use_winograd_convolution;
          local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
          local_78.use_int8_inference = opt->use_int8_inference;
          local_78.use_vulkan_compute = opt->use_vulkan_compute;
          uVar46._0_1_ = opt->use_bf16_storage;
          uVar46._1_1_ = opt->use_fp16_packed;
          uVar46._2_1_ = opt->use_fp16_storage;
          uVar46._3_1_ = opt->use_fp16_arithmetic;
          uVar46._4_1_ = opt->use_int8_packed;
          uVar46._5_1_ = opt->use_int8_storage;
          uVar46._6_1_ = opt->use_int8_arithmetic;
          uVar46._7_1_ = opt->use_packing_layout;
          local_78.vulkan_device_index = opt->vulkan_device_index;
          local_78.use_reserved_1 = opt->use_reserved_1;
          local_78.use_image_storage = opt->use_image_storage;
          local_78.use_tensor_storage = opt->use_tensor_storage;
          local_78.use_reserved_2 = opt->use_reserved_2;
          local_78.flush_denormals = opt->flush_denormals;
          local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
          local_78.use_shader_local_memory = opt->use_shader_local_memory;
          local_78.use_cooperative_matrix = opt->use_cooperative_matrix;
          local_78.use_winograd23_convolution = opt->use_winograd23_convolution;
          local_78.use_winograd43_convolution = opt->use_winograd43_convolution;
          local_78.use_winograd63_convolution = opt->use_winograd63_convolution;
          local_78.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
          local_78.use_fp16_uniform = opt->use_fp16_uniform;
          local_78.use_int8_uniform = opt->use_int8_uniform;
          local_78.use_reserved_9 = opt->use_reserved_9;
          local_78.use_reserved_10 = opt->use_reserved_10;
          local_78.use_reserved_11 = opt->use_reserved_11;
          local_78.blob_allocator = opt->workspace_allocator;
          local_78._32_8_ = uVar46 & 0xffffffffffffff;
          quantize_to_int8(hidden_state,&local_218,&local_1c8,&local_78);
        }
        pvVar40 = local_128.data;
        pvVar6 = local_178.data;
        pvVar41 = local_218.data;
        if (0 < (int)_w_00) {
          lVar43 = (long)local_178.w;
          lVar47 = (long)(int)uVar49;
          lVar39 = CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize);
          pvVar52 = weight_xc_int8->data;
          iVar48 = weight_xc_int8->w;
          pvVar50 = weight_hc_int8->data;
          iVar2 = weight_hc_int8->w;
          sVar3 = weight_hc_int8->elemsize;
          pvVar4 = bias_c->data;
          local_88 = CONCAT44(*(undefined4 *)((long)local_d8.data + lVar47 * 4),*local_1c8.data);
          uStack_80 = 0;
          sVar5 = weight_xc_int8->elemsize;
          uVar45 = 0;
          do {
            if ((int)_w < 1) {
              fVar53 = 0.0;
            }
            else {
              uVar46 = 0;
              iVar42 = 0;
              do {
                iVar42 = iVar42 + (int)*(char *)((long)pvVar6 + uVar46 + lVar43 * lVar47 * lVar39) *
                                  (int)*(char *)((long)pvVar52 + uVar46);
                uVar46 = uVar46 + 1;
              } while (_w != uVar46);
              fVar53 = (float)iVar42;
            }
            uVar46 = 0;
            iVar42 = 0;
            do {
              iVar42 = iVar42 + (int)*(char *)((long)pvVar41 + uVar46) *
                                (int)*(char *)((long)pvVar50 + uVar46);
              uVar46 = uVar46 + 1;
            } while (uVar44 != uVar46);
            auVar54._0_4_ = (float)iVar42;
            auVar54._4_4_ = fVar53;
            auVar54._8_8_ = 0;
            auVar55._4_4_ = weight_xc_int8_scales[uVar45] * local_88._4_4_;
            auVar55._0_4_ = weight_hc_int8_scales[uVar45] * (float)local_88;
            auVar55._8_4_ = (float)uStack_80 * 0.0;
            auVar55._12_4_ = uStack_80._4_4_ * 0.0;
            auVar55 = divps(auVar54,auVar55);
            fVar53 = tanhf(auVar55._4_4_ + auVar55._0_4_ + *(float *)((long)pvVar4 + uVar45 * 4));
            *(float *)((long)pvVar40 + uVar45 * 4) = fVar53;
            uVar45 = uVar45 + 1;
            pvVar52 = (void *)((long)pvVar52 + (long)iVar48 * sVar5);
            pvVar50 = (void *)((long)pvVar50 + (long)iVar2 * sVar3);
          } while (uVar45 != uVar44);
          if (0 < (int)_w_00) {
            iVar48 = top_blob->w;
            sVar3 = top_blob->elemsize;
            pvVar41 = top_blob->data;
            pvVar6 = hidden_state->data;
            uVar45 = 0;
            do {
              uVar1 = *(undefined4 *)((long)local_128.data + uVar45 * 4);
              *(undefined4 *)((long)pvVar6 + uVar45 * 4) = uVar1;
              *(undefined4 *)((long)pvVar41 + uVar45 * 4 + iVar48 * lVar47 * sVar3) = uVar1;
              uVar45 = uVar45 + 1;
            } while (uVar44 != uVar45);
          }
        }
        uVar51 = uVar51 + 1;
      } while (uVar51 != _h);
    }
    piVar38 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
    if (piVar38 != (int *)0x0) {
      LOCK();
      *piVar38 = *piVar38 + -1;
      UNLOCK();
      if (*piVar38 == 0) {
        if (local_1c8.allocator == (Allocator *)0x0) {
          if ((float *)local_1c8.data != (float *)0x0) {
            free(local_1c8.data);
          }
        }
        else {
          (*(local_1c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar38 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
    if (piVar38 != (int *)0x0) {
      LOCK();
      *piVar38 = *piVar38 + -1;
      UNLOCK();
      if (*piVar38 == 0) {
        if (local_218.allocator == (Allocator *)0x0) {
          if (local_218.data != (void *)0x0) {
            free(local_218.data);
          }
        }
        else {
          (*(local_218.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar38 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar38 != (int *)0x0) {
      LOCK();
      *piVar38 = *piVar38 + -1;
      UNLOCK();
      if (*piVar38 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar38 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
    if (piVar38 != (int *)0x0) {
      LOCK();
      *piVar38 = *piVar38 + -1;
      UNLOCK();
      if (*piVar38 == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          if (local_178.data != (void *)0x0) {
            free(local_178.data);
          }
        }
        else {
          (*(local_178.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar48 = 0;
  }
  piVar38 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
  if (piVar38 != (int *)0x0) {
    LOCK();
    *piVar38 = *piVar38 + -1;
    UNLOCK();
    if (*piVar38 == 0) {
      if (local_128.allocator == (Allocator *)0x0) {
        if (local_128.data != (void *)0x0) {
          free(local_128.data);
        }
      }
      else {
        (*(local_128.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar48;
}

Assistant:

static int rnn_int8(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc_int8, const float* weight_xc_int8_scales, const Mat& bias_c, const Mat& weight_hc_int8, const float* weight_hc_int8_scales, Mat& hidden_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // num_output
    Mat gates(num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // dynamic quantize bottom_blob
    Mat bottom_blob_int8(size, T, (size_t)1u, 1, opt.workspace_allocator);
    Mat bottom_blob_int8_scales(T, (size_t)4u, 1, opt.workspace_allocator);
    {
        for (int t = 0; t < T; t++)
        {
            const float* x = bottom_blob.row(t);

            float absmax = 0.f;
            for (int i = 0; i < size; i++)
            {
                absmax = std::max(absmax, (float)fabs(x[i]));
            }

            bottom_blob_int8_scales[t] = 127.f / absmax;
        }

        Option opt_quant = opt;
        opt_quant.blob_allocator = opt.workspace_allocator;
        opt_quant.use_packing_layout = false;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_quant);
    }

    Mat hidden_state_int8(num_output, (size_t)1u, 1, opt.workspace_allocator);
    Mat hidden_state_int8_scales(1, (size_t)4u, 1, opt.workspace_allocator);

    // unroll
    for (int t = 0; t < T; t++)
    {
        int ti = reverse ? T - 1 - t : t;

        // dynamic quantize hidden_state
        {
            float absmax = 0.f;
            for (int i = 0; i < num_output; i++)
            {
                absmax = std::max(absmax, (float)fabs(hidden_state[i]));
            }

            if (absmax == 0.f)
            {
                hidden_state_int8_scales[0] = 1.f;
                hidden_state_int8.fill<signed char>(0);
            }
            else
            {
                hidden_state_int8_scales[0] = 127.f / absmax;

                Option opt_quant = opt;
                opt_quant.blob_allocator = opt.workspace_allocator;
                opt_quant.use_packing_layout = false;
                quantize_to_int8(hidden_state, hidden_state_int8, hidden_state_int8_scales, opt_quant);
            }
        }

        const signed char* x = bottom_blob_int8.row<const signed char>(ti);
        const signed char* hs = hidden_state_int8;
        const float descale_x = 1.f / bottom_blob_int8_scales[ti];
        const float descale_h = 1.f / hidden_state_int8_scales[0];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            const signed char* weight_xc_int8_ptr = weight_xc_int8.row<const signed char>(q);
            const signed char* weight_hc_int8_ptr = weight_hc_int8.row<const signed char>(q);

            const float descale_xc = 1.f / weight_xc_int8_scales[q];
            const float descale_hc = 1.f / weight_hc_int8_scales[q];

            int Hx = 0;
            for (int i = 0; i < size; i++)
            {
                Hx += weight_xc_int8_ptr[i] * x[i];
            }

            int Hh = 0;
            for (int i = 0; i < num_output; i++)
            {
                Hh += weight_hc_int8_ptr[i] * hs[i];
            }

            float H = bias_c[q] + Hx * (descale_x * descale_xc) + Hh * (descale_h * descale_hc);

            H = tanhf(H);

            gates[q] = H;
        }

        float* output_data = top_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            float H = gates[q];

            hidden_state[q] = H;
            output_data[q] = H;
        }
    }

    return 0;
}